

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  size_t sVar2;
  undefined1 *puVar3;
  mz_bool mVar4;
  mz_uint32 mVar5;
  mz_uint flags;
  tdefl_status tVar6;
  time_t *ptVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  mz_uint64 *pmVar11;
  undefined1 *puVar12;
  mz_uint64 *pmVar13;
  mz_uint64 mVar14;
  char cVar15;
  ushort uVar16;
  undefined4 uVar17;
  long lVar18;
  ulong uVar19;
  mz_uint64 *pmVar20;
  mz_zip_error mVar21;
  undefined1 uVar22;
  int iVar23;
  byte bVar24;
  long lVar25;
  undefined6 in_register_0000008a;
  char *pcVar26;
  size_t orig_size;
  mz_uint64 mVar27;
  uint uVar28;
  uint level;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  bool local_15a;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint local_154;
  size_t local_150;
  time_t cur_time;
  undefined1 local_140;
  undefined1 uStack_13f;
  undefined1 uStack_13e;
  undefined1 uStack_13d;
  undefined1 uStack_13c;
  undefined1 uStack_13b;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined8 local_12c;
  undefined2 local_124;
  undefined1 local_122;
  undefined2 local_121;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  tdefl_compressor *local_118;
  size_t local_110;
  mz_uint64 comp_size;
  mz_uint8 *local_100;
  char *local_f8;
  undefined4 local_ec;
  mz_uint64 local_e8;
  undefined1 *local_e0;
  mz_uint64 local_dir_header_ofs;
  uint local_cc;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  ulong local_b8;
  mz_uint8 *local_b0;
  mz_ulong local_a8;
  undefined4 local_a0;
  mz_uint32 central_dir_ofs;
  undefined4 local_98;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  undefined4 uStack_82;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  ulong local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  local_ec = (int)CONCAT62(in_register_0000008a,comment_size);
  dos_time = 0;
  dos_date = 0;
  local_dir_header_ofs = pZip->m_archive_size;
  comp_size = 0;
  uVar28 = 6;
  if (-1 < (int)level_and_flags) {
    uVar28 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar16 = (ushort)((uVar28 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar16 = 8;
  }
  pmVar1 = pZip->m_pState;
  if ((uVar28 >> 0x10 & 1) == 0) {
    uVar16 = uVar16 + 0x800;
  }
  level = uVar28 & 0xf;
  if ((pmVar1 == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_0012aaee:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < level)))) goto LAB_0012aaee;
  if (pmVar1->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && (uVar28 & 0x400) == 0) goto LAB_0012aaee;
  cVar15 = *pArchive_name;
  if (cVar15 == '/') {
LAB_0012ab7c:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_a8 = (ulong)uncomp_crc32;
  local_e0 = &uStack_139;
  local_68 = &uStack_13a;
  local_70 = &uStack_13b;
  pcVar26 = pArchive_name + 1;
  while (cVar15 != '\0') {
    if ((cVar15 == ':') || (cVar15 == '\\')) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      goto LAB_0012ab7c;
    }
    cVar15 = *pcVar26;
    pcVar26 = pcVar26 + 1;
  }
  local_b0 = (mz_uint8 *)pBuf;
  local_110 = buf_size;
  local_f8 = pArchive_name;
  local_e8 = local_dir_header_ofs;
  local_60 = pComment;
  ptVar7 = last_modified;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar7 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar7,&dos_time,&dos_date);
  if ((uVar28 & 0x400) == 0) {
    local_a8 = mz_crc32(0,local_b0,local_110);
    uncomp_size = local_110;
    if (local_110 < 4) {
      level = 0;
    }
    local_15a = local_110 < 4 || ((uVar28 & 0xf) == 0 || (uVar28 & 0x400) != 0);
  }
  else {
    local_15a = true;
  }
  local_150 = strlen(local_f8);
  if (0xffff < local_150) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  local_154 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  local_c0 = (ulong)(ushort)local_ec;
  sVar8 = (pmVar1->m_central_dir).m_size;
  if (0xfffffffe < sVar8 + 0x4a + local_c0 + local_150) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      return 0;
    }
    return 0;
  }
  lVar18 = 0x1c;
  local_b8 = (ulong)user_extra_data_central_len;
  uVar10 = (ulong)local_154;
  local_78 = (ulong)user_extra_data_len;
  if (pmVar1->m_zip64 == 0) {
    if (pZip->m_archive_size +
        local_b8 + local_78 + local_c0 + -0xffffff8e + local_150 * 2 + uVar10 + sVar8 <
        0xffffffff00000000) {
      pmVar1->m_zip64 = 1;
    }
    else {
      lVar18 = 0;
    }
  }
  if ((local_150 == 0) || (local_f8[local_150 - 1] != '/')) {
    local_a0 = 0;
  }
  else {
    local_a0 = (undefined4)CONCAT71((int7)(local_150 >> 8),0x10);
    if (uncomp_size != 0 || local_110 != 0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        return 0;
      }
      return 0;
    }
  }
  uVar19 = lVar18 + 0x2e + local_c0 + local_150 + sVar8;
  if ((((pmVar1->m_central_dir).m_capacity < uVar19) &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar19,1), mVar4 == 0)) ||
     ((uVar19 = (pmVar1->m_central_dir_offsets).m_size + 1,
      (pmVar1->m_central_dir_offsets).m_capacity < uVar19 &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir_offsets,uVar19,1),
      mVar4 == 0)))) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    return 0;
  }
  if (local_110 == 0 || local_15a != false) {
    local_118 = (tdefl_compressor *)0x0;
  }
  else {
    local_118 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_118 == (tdefl_compressor *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
  }
  mVar4 = mz_zip_writer_write_zeros(pZip,local_e8,local_154);
  if (mVar4 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar10;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0x1eb0,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  uStack_88 = 0;
  uStack_82 = 0;
  uStack_7e = 0;
  uStack_7d = 0;
  uStack_7c = 0;
  uStack_7b = 0;
  local_98 = 0;
  uStack_94 = 0;
  uStack_93 = 0;
  uStack_92 = 0;
  uStack_91 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8d = 0;
  uStack_8c = 0;
  uStack_8b = 0;
  uStack_8a = 0;
  uVar10 = local_e8 + uVar10;
  bVar24 = local_15a ^ 1U | (uVar28 & 0x400) != 0;
  local_154 = (mz_uint)uVar16;
  iVar23 = (uint)bVar24 << 3;
  local_c4 = iVar23;
  if (pmVar1->m_zip64 == 0) {
    if (uVar10 >> 0x20 != 0 || comp_size._4_4_ != 0) goto LAB_0012af3f;
    uStack_94 = 0;
    if (bVar24 != 0) {
      uStack_94 = 0x14;
    }
    local_98 = 0x4034b50;
    local_c8 = (uint)dos_time;
    local_cc = (uint)dos_date;
    uStack_92 = (undefined1)uVar16;
    uStack_91 = (undefined1)(uVar16 >> 8);
    uStack_8e = (undefined1)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    uStack_82 = 0;
    uStack_7e = (undefined1)local_150;
    uStack_7d = (undefined1)(local_150 >> 8);
    uStack_7c = (undefined1)user_extra_data_len;
    uStack_7b = (undefined1)(user_extra_data_len >> 8);
    uStack_90 = (char)iVar23;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&local_98,0x1e);
    sVar2 = local_150;
    if (sVar8 != 0x1e) {
LAB_0012b365:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar10 + 0x1e,local_f8,local_150);
    if (sVar8 != sVar2) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
      goto LAB_0012b365;
    }
    mVar27 = uVar10 + 0x1e + local_150;
    mVar5 = 0;
LAB_0012b15c:
    local_100 = (mz_uint8 *)0x0;
LAB_0012b165:
    uVar10 = local_78;
    if (user_extra_data_len != 0) {
      sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,user_extra_data,local_78);
      if (sVar8 != uVar10) goto LAB_0012b1de;
      mVar27 = mVar27 + local_78;
    }
    sVar8 = local_110;
    if (local_15a == false) {
      if (local_110 != 0) {
        cur_time._0_4_ = SUB84(pZip,0);
        cur_time._4_1_ = (undefined1)((ulong)pZip >> 0x20);
        cur_time._5_1_ = (undefined1)((ulong)pZip >> 0x28);
        cur_time._6_1_ = (undefined1)((ulong)pZip >> 0x30);
        cur_time._7_1_ = (undefined1)((ulong)pZip >> 0x38);
        local_140 = (undefined1)mVar27;
        uStack_13f = (undefined1)(mVar27 >> 8);
        uStack_13e = (undefined1)(mVar27 >> 0x10);
        uStack_13d = (undefined1)(mVar27 >> 0x18);
        uStack_13c = (undefined1)(mVar27 >> 0x20);
        uStack_13b = (undefined1)(mVar27 >> 0x28);
        uStack_13a = (undefined1)(mVar27 >> 0x30);
        uStack_139 = (undefined1)(mVar27 >> 0x38);
        local_138 = 0;
        uStack_137 = 0;
        uStack_136 = 0;
        uStack_135 = 0;
        uStack_134 = 0;
        uStack_133 = 0;
        uStack_132 = 0;
        uStack_131 = 0;
        flags = tdefl_create_comp_flags_from_zip_params(level,-0xf,0);
        tVar6 = tdefl_init(local_118,mz_zip_writer_add_put_buf_callback,&cur_time,flags);
        if ((tVar6 != TDEFL_STATUS_OKAY) ||
           (tVar6 = tdefl_compress_buffer(local_118,local_b0,local_110,TDEFL_FINISH),
           tVar6 != TDEFL_STATUS_DONE)) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
          pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
          return 0;
        }
        mVar27 = CONCAT17(uStack_139,
                          CONCAT16(uStack_13a,
                                   CONCAT15(uStack_13b,
                                            CONCAT14(uStack_13c,
                                                     CONCAT13(uStack_13d,
                                                              CONCAT12(uStack_13e,
                                                                       CONCAT11(uStack_13f,local_140
                                                                               )))))));
        comp_size = CONCAT17(uStack_131,
                             CONCAT16(uStack_132,
                                      CONCAT15(uStack_133,
                                               CONCAT14(uStack_134,
                                                        CONCAT13(uStack_135,
                                                                 CONCAT12(uStack_136,
                                                                          CONCAT11(uStack_137,
                                                                                   local_138)))))));
      }
    }
    else {
      sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,local_b0,local_110);
      if (sVar9 != sVar8) goto LAB_0012b1d2;
      mVar27 = mVar27 + local_110;
      comp_size = local_110;
    }
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    if (uncomp_size == 0) {
      uVar10 = 0;
    }
    else {
      if ((local_154 & 8) == 0) {
        __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x1f39,
                      "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                     );
      }
      cur_time._0_4_ = 0x8074b50;
      cur_time._6_1_ = (undefined1)(local_a8 >> 0x10);
      cur_time._4_1_ = (undefined1)local_a8;
      cur_time._5_1_ = (undefined1)(local_a8 >> 8);
      cur_time._7_1_ = (undefined1)(local_a8 >> 0x18);
      if (local_100 == (mz_uint8 *)0x0) {
        if (comp_size >> 0x20 != 0) {
LAB_0012af3f:
          pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
          return 0;
        }
        puVar12 = &uStack_13c;
        uStack_13f = (undefined1)(comp_size >> 8);
        uStack_13e = (undefined1)(comp_size >> 0x10);
        uStack_13d = (undefined1)(comp_size >> 0x18);
        lVar18 = 0x18;
        sVar8 = 0x10;
        lVar25 = 8;
        sVar9 = sVar8;
        uVar22 = (char)uncomp_size;
      }
      else {
        puVar12 = &uStack_134;
        auVar30 = vpbroadcastq_avx512vl();
        auVar30 = vpsrlvq_avx2(auVar30,_DAT_0014c040);
        auVar29 = vpmovqb_avx512vl(auVar30);
        uStack_13f = auVar29[0];
        uStack_13e = auVar29[1];
        uStack_13d = auVar29[2];
        uStack_13c = auVar29[3];
        uStack_13b = (undefined1)(comp_size >> 0x28);
        uStack_13a = (undefined1)(comp_size >> 0x30);
        uStack_139 = (undefined1)(comp_size >> 0x38);
        uStack_136 = (undefined1)(uncomp_size >> 0x10);
        uStack_137 = (undefined1)(uncomp_size >> 8);
        uStack_135 = (undefined1)(uncomp_size >> 0x18);
        lVar18 = 0x38;
        sVar8 = 0x30;
        lVar25 = 0x28;
        local_70 = &uStack_133;
        local_68 = &uStack_132;
        local_e0 = &uStack_131;
        sVar9 = 0x18;
        uVar22 = (char)(uncomp_size >> 0x20);
        local_138 = (char)uncomp_size;
      }
      puVar3 = local_68;
      local_140 = (undefined1)comp_size;
      *puVar12 = uVar22;
      *local_70 = (char)(uncomp_size >> lVar25);
      puVar12 = local_e0;
      *puVar3 = (char)(uncomp_size >> sVar8);
      *puVar12 = (char)(uncomp_size >> lVar18);
      sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,&cur_time,sVar9);
      if (sVar8 != sVar9) {
        return 0;
      }
      mVar27 = mVar27 + sVar9;
      uVar10 = uncomp_size;
    }
    if (local_100 != (mz_uint8 *)0x0) {
      pmVar11 = &uncomp_size;
      pmVar20 = &comp_size;
      if (uVar10 < 0xffffffff) {
        pmVar20 = (mz_uint64 *)0x0;
        pmVar11 = (mz_uint64 *)0x0;
      }
      pmVar13 = (mz_uint64 *)0x0;
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar13 = &local_dir_header_ofs;
      }
      mVar5 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar11,pmVar20,pmVar13);
      uVar10 = uncomp_size;
    }
    pmVar1 = pZip->m_pState;
    uVar19 = (pmVar1->m_central_dir).m_size;
    central_dir_ofs = (mz_uint32)uVar19;
    if ((local_dir_header_ofs >> 0x20 == 0) || (pmVar1->m_zip64 != 0)) {
      local_e0 = (undefined1 *)(ulong)(mVar5 & 0xffff);
      if (uVar19 + 0x2e + local_150 + (long)local_e0 + local_c0 + local_b8 < 0xffffffff) {
        local_124 = 0;
        cur_time._6_1_ = 0;
        if (bVar24 != 0) {
          cur_time._6_1_ = 0x14;
        }
        cur_time._4_1_ = 0;
        cur_time._5_1_ = 0;
        cur_time._7_1_ = 0;
        uStack_13d = 0;
        cur_time._0_4_ = 0x2014b50;
        local_140 = (undefined1)local_154;
        uStack_13f = (undefined1)(local_154 >> 8);
        uStack_13e = (undefined1)local_c4;
        uStack_13c = (undefined1)local_c8;
        uStack_13b = (undefined1)(local_c8 >> 8);
        uStack_13a = (undefined1)local_cc;
        uStack_139 = (undefined1)(local_cc >> 8);
        uStack_136 = (undefined1)(local_a8 >> 0x10);
        local_138 = (undefined1)local_a8;
        uStack_137 = (undefined1)(local_a8 >> 8);
        uStack_135 = (undefined1)(local_a8 >> 0x18);
        uVar17 = (undefined4)comp_size;
        if (0xfffffffe < comp_size) {
          uVar17 = 0xffffffff;
        }
        uStack_134 = (undefined1)uVar17;
        uStack_133 = (undefined1)((uint)uVar17 >> 8);
        if (0xfffffffe < uVar10) {
          uVar10 = 0xffffffff;
        }
        uStack_132 = (undefined1)((uint)uVar17 >> 0x10);
        uStack_131 = (undefined1)((uint)uVar17 >> 0x18);
        local_130 = (undefined1)uVar10;
        local_12f = (undefined1)(uVar10 >> 8);
        local_12e = (undefined1)(uVar10 >> 0x10);
        local_12d = (undefined1)(uVar10 >> 0x18);
        uVar10 = uVar19 + 0x2e;
        local_12c = (ulong)CONCAT15((char)((uint)local_ec >> 8),
                                    CONCAT14((char)local_ec,
                                             CONCAT13((char)(mVar5 + user_extra_data_central_len >>
                                                            8),CONCAT12((char)(mVar5 + 
                                                  user_extra_data_central_len),(short)local_150))));
        local_122 = (undefined1)local_a0;
        local_121 = 0;
        local_11f = 0;
        mVar14 = 0xffffffff;
        if (local_dir_header_ofs < 0xffffffff) {
          mVar14 = local_dir_header_ofs;
        }
        local_11e = (undefined1)mVar14;
        local_11d = (undefined1)(mVar14 >> 8);
        local_11c = (undefined1)(mVar14 >> 0x10);
        local_11b = (undefined1)(mVar14 >> 0x18);
        if ((uVar10 <= (pmVar1->m_central_dir).m_capacity) ||
           (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar10,1), mVar4 != 0))
        {
          (pmVar1->m_central_dir).m_size = uVar10;
          uVar10 = (ulong)(pmVar1->m_central_dir).m_element_size;
          memcpy((void *)(uVar19 * uVar10 + (long)(pmVar1->m_central_dir).m_p),&cur_time,
                 uVar10 * 0x2e);
          sVar8 = (pmVar1->m_central_dir).m_size;
          uVar10 = sVar8 + local_150;
          if ((uVar10 <= (pmVar1->m_central_dir).m_capacity) ||
             (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar10,1), mVar4 != 0
             )) {
            (pmVar1->m_central_dir).m_size = uVar10;
            uVar10 = (ulong)(pmVar1->m_central_dir).m_element_size;
            memcpy((void *)(sVar8 * uVar10 + (long)(pmVar1->m_central_dir).m_p),local_f8,
                   local_150 * uVar10);
            sVar8 = (pmVar1->m_central_dir).m_size;
            uVar10 = sVar8 + (long)local_e0;
            if ((uVar10 <= (pmVar1->m_central_dir).m_capacity) ||
               (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar10,1),
               mVar4 != 0)) {
              (pmVar1->m_central_dir).m_size = uVar10;
              uVar10 = (ulong)(pmVar1->m_central_dir).m_element_size;
              memcpy((void *)(sVar8 * uVar10 + (long)(pmVar1->m_central_dir).m_p),local_100,
                     (long)local_e0 * uVar10);
              sVar8 = (pmVar1->m_central_dir).m_size;
              uVar10 = sVar8 + local_b8;
              if ((uVar10 <= (pmVar1->m_central_dir).m_capacity) ||
                 (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar10,1),
                 mVar4 != 0)) {
                (pmVar1->m_central_dir).m_size = uVar10;
                uVar10 = (ulong)(pmVar1->m_central_dir).m_element_size;
                memcpy((void *)(sVar8 * uVar10 + (long)(pmVar1->m_central_dir).m_p),
                       user_extra_data_central,local_b8 * uVar10);
                sVar8 = (pmVar1->m_central_dir).m_size;
                uVar10 = sVar8 + local_c0;
                if ((uVar10 <= (pmVar1->m_central_dir).m_capacity) ||
                   (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar10,1),
                   mVar4 != 0)) {
                  (pmVar1->m_central_dir).m_size = uVar10;
                  uVar10 = (ulong)(pmVar1->m_central_dir).m_element_size;
                  memcpy((void *)(sVar8 * uVar10 + (long)(pmVar1->m_central_dir).m_p),local_60,
                         local_c0 * uVar10);
                  sVar8 = (pmVar1->m_central_dir_offsets).m_size;
                  uVar10 = sVar8 + 1;
                  if ((uVar10 <= (pmVar1->m_central_dir_offsets).m_capacity) ||
                     (mVar4 = mz_zip_array_ensure_capacity
                                        (pZip,&pmVar1->m_central_dir_offsets,uVar10,1), mVar4 != 0))
                  {
                    (pmVar1->m_central_dir_offsets).m_size = uVar10;
                    uVar10 = (ulong)(pmVar1->m_central_dir_offsets).m_element_size;
                    memcpy((void *)(sVar8 * uVar10 + (long)(pmVar1->m_central_dir_offsets).m_p),
                           &central_dir_ofs,uVar10);
                    pZip->m_total_files = pZip->m_total_files + 1;
                    pZip->m_archive_size = mVar27;
                    return 1;
                  }
                }
              }
            }
          }
        }
        mVar21 = MZ_ZIP_ALLOC_FAILED;
        if ((uVar19 <= (pmVar1->m_central_dir).m_capacity) ||
           (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar19,0), mVar4 != 0))
        {
          (pmVar1->m_central_dir).m_size = uVar19;
        }
      }
      else {
        mVar21 = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      }
    }
    else {
      mVar21 = MZ_ZIP_FILE_TOO_LARGE;
    }
    pZip->m_last_error = mVar21;
    return 0;
  }
  local_e8 = uVar10;
  if (local_dir_header_ofs < 0xffffffff && uncomp_size < 0xffffffff) {
    local_100 = (mz_uint8 *)0x0;
    mVar5 = 0;
  }
  else {
    pmVar11 = (mz_uint64 *)0x0;
    pmVar13 = &comp_size;
    pmVar20 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar13 = pmVar11;
      pmVar20 = pmVar11;
    }
    local_100 = extra_data;
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar11 = &local_dir_header_ofs;
    }
    mVar5 = mz_zip_writer_create_zip64_extra_data(local_100,pmVar20,pmVar13,pmVar11);
  }
  sVar2 = local_150;
  local_98 = 0x4034b50;
  local_cc = (uint)dos_date;
  uStack_94 = 0;
  if (bVar24 != 0) {
    uStack_94 = 0x14;
  }
  uStack_93 = 0;
  local_c8 = (uint)dos_time;
  uStack_92 = (undefined1)local_154;
  uStack_91 = (undefined1)(local_154 >> 8);
  uStack_8f = 0;
  uStack_8e = (undefined1)dos_time;
  uStack_8d = (undefined1)(dos_time >> 8);
  uStack_8c = (undefined1)dos_date;
  uStack_8b = (undefined1)(dos_date >> 8);
  uStack_8a = 0;
  uStack_88 = 0;
  uStack_82 = 0;
  uStack_7e = (undefined1)local_150;
  uStack_7d = (undefined1)(local_150 >> 8);
  uStack_7c = (undefined1)(mVar5 + user_extra_data_len);
  uStack_7b = (undefined1)(mVar5 + user_extra_data_len >> 8);
  uStack_90 = (char)iVar23;
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&local_98,0x1e);
  if (sVar8 != 0x1e) goto LAB_0012b1de;
  mVar27 = local_e8 + 0x1e;
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,local_f8,sVar2);
  if (sVar8 == sVar2) {
    mVar27 = mVar27 + sVar2;
    if (local_100 == (mz_uint8 *)0x0) goto LAB_0012b15c;
    uVar10 = (ulong)mVar5;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,extra_data,uVar10);
    if (sVar8 != uVar10) goto LAB_0012b1de;
    mVar27 = mVar27 + uVar10;
    goto LAB_0012b165;
  }
LAB_0012b1d2:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
LAB_0012b1de:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive* pZip,
                                           const char* pArchive_name,
                                           const void* pBuf,
                                           size_t buf_size,
                                           const void* pComment,
                                           mz_uint16 comment_size,
                                           mz_uint level_and_flags,
                                           mz_uint64 uncomp_size,
                                           mz_uint32 uncomp_crc32,
                                           MZ_TIME_T* last_modified,
                                           const char* user_extra_data,
                                           mz_uint user_extra_data_len,
                                           const char* user_extra_data_central,
                                           mz_uint user_extra_data_central_len) {

    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor* pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state* pState;
    mz_uint8* pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf))
            || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if (pZip->m_total_files == MZ_UINT16_MAX) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF)) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL) {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

    if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8*)pBuf, buf_size);
        uncomp_size = buf_size;
        if (uncomp_size <= 3) {
            level = 0;
            store_data_uncompressed = MZ_TRUE;
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size
            + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64) {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
                + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len
                + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
                + MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip,
                                   &pState->m_central_dir,
                                   MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size
                                           + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0)))
            || (!mz_zip_array_ensure_room(
                    pZip,
                    &pState->m_central_dir_offsets,
                    1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size)) {
        if (NULL == (pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes)) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment) {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64) {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                               (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                               ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   extra_size + user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL) {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len)
                != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (store_data_uncompressed) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size) {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp,
                        mz_zip_writer_add_put_buf_callback,
                        &state,
                        tdefl_create_comp_flags_from_zip_params(level,
                                                                -15,
                                                                MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
                || (tdefl_compress_buffer(
                        pComp,
                        pBuf,
                        buf_size,
                        TDEFL_FINISH) != TDEFL_STATUS_DONE)) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size) {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL) {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           cur_archive_file_ofs,
                           local_dir_footer,
                           local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL) {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                           (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                           ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip,
                                          pArchive_name,
                                          (mz_uint16)archive_name_size,
                                          pExtra_data,
                                          extra_size,
                                          pComment,
                                          comment_size,
                                          uncomp_size,
                                          comp_size,
                                          uncomp_crc32,
                                          method,
                                          bit_flags,
                                          dos_time,
                                          dos_date,
                                          local_dir_header_ofs,
                                          ext_attributes,
                                          user_extra_data_central,
                                          user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}